

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O3

Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
renderdesc::Loader::readVariable
          (Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Loader *this,Mapping *m,string *name)

{
  size_type sVar1;
  long *plVar2;
  long *plVar3;
  ulong *puVar4;
  ulong *puVar5;
  ExpectedRef<const_Value,_std::string> value_result;
  long *local_c0;
  long local_b8;
  long local_b0;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  ulong *local_a0;
  undefined8 local_98;
  ulong local_90;
  long lStack_88;
  undefined1 local_80 [32];
  char local_60;
  ulong *local_58;
  undefined8 local_50;
  ulong local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  yaml::Mapping::getValue
            ((ExpectedRef<const_Value,_std::string> *)
             &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                *)local_80)->value_,m,name);
  if (local_60 != '\0') {
    yaml::Value::getInt_abi_cxx11_(__return_storage_ptr__,(Value *)local_80._0_8_);
    goto LAB_0012f9ca;
  }
  std::operator+(&local_38,"Cannot read variable ",name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_38);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_b0 = *plVar3;
    uStack_a8 = (undefined4)plVar2[3];
    uStack_a4 = *(undefined4 *)((long)plVar2 + 0x1c);
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar3;
    local_c0 = (long *)*plVar2;
  }
  local_b8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_60 == '\x01') {
    aAppDebugPrintf("[CRASH] Expected has value");
    aAppTerminate(-1);
  }
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_c0,local_80._0_8_);
  local_a0 = &local_90;
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_90 = *puVar5;
    lStack_88 = plVar2[3];
    puVar4 = local_a0;
  }
  else {
    local_90 = *puVar5;
    puVar4 = (ulong *)*plVar2;
  }
  local_48 = local_90;
  sVar1 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_58 = &local_48;
  if (puVar4 == local_a0) {
    lStack_40 = lStack_88;
    local_90 = (ulong)local_90._1_7_ << 8;
    (__return_storage_ptr__->field_0).value_ = (long)((long)&__return_storage_ptr__->field_0 + 0x10)
    ;
LAB_0012f96e:
    (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity = local_48;
    *(long *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) = lStack_40;
  }
  else {
    local_90 = (ulong)local_90._1_7_ << 8;
    (__return_storage_ptr__->field_0).value_ = (long)((long)&__return_storage_ptr__->field_0 + 0x10)
    ;
    if (puVar4 == local_58) goto LAB_0012f96e;
    (__return_storage_ptr__->field_0).value_ = (long)puVar4;
    (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity = local_48;
  }
  local_98 = 0;
  (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar1;
  local_50 = 0;
  local_48 = local_48 & 0xffffffffffffff00;
  __return_storage_ptr__->has_value_ = false;
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
LAB_0012f9ca:
  if ((local_60 == '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                    *)local_80)->error_).error_ + 0x10U))) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<long int, std::string> readVariable(const yaml::Mapping &m, const std::string &name) {
		auto value_result = m.getValue(name);
		if (!value_result)
			return Unexpected("Cannot read variable " + name + ": " + value_result.error());
		// FIXME read actual variable
		return value_result.value().get().getInt();
	}